

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostkey.c
# Opt level: O1

int hostkey_method_ssh_rsa_initPEMFromMemory
              (LIBSSH2_SESSION *session,char *privkeyfiledata,size_t privkeyfiledata_len,
              uchar *passphrase,void **abstract)

{
  int iVar1;
  int iVar2;
  RSA *rsactx;
  RSA *local_30;
  
  if ((RSA *)*abstract != (RSA *)0x0) {
    RSA_free((RSA *)*abstract);
    *abstract = (void *)0x0;
  }
  iVar1 = _libssh2_rsa_new_private_frommemory
                    (&local_30,session,privkeyfiledata,privkeyfiledata_len,passphrase);
  iVar2 = -1;
  if (iVar1 == 0) {
    *abstract = local_30;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int
hostkey_method_ssh_rsa_initPEMFromMemory(LIBSSH2_SESSION * session,
                                         const char *privkeyfiledata,
                                         size_t privkeyfiledata_len,
                                         unsigned const char *passphrase,
                                         void **abstract)
{
    libssh2_rsa_ctx *rsactx;
    int ret;

    if(*abstract) {
        hostkey_method_ssh_rsa_dtor(session, abstract);
        *abstract = NULL;
    }

    ret = _libssh2_rsa_new_private_frommemory(&rsactx, session,
                                              privkeyfiledata,
                                              privkeyfiledata_len, passphrase);
    if(ret) {
        return -1;
    }

    *abstract = rsactx;

    return 0;
}